

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O1

void __thiscall IsStringTest_IsString_Test<char>::TestBody(IsStringTest_IsString_Test<char> *this)

{
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8;
  
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TYPED_TEST(IsStringTest, IsString) {
  EXPECT_TRUE((fmt::internal::is_string<TypeParam *>::value));
  EXPECT_TRUE((fmt::internal::is_string<const TypeParam *>::value));
  EXPECT_TRUE((fmt::internal::is_string<TypeParam[2]>::value));
  EXPECT_TRUE((fmt::internal::is_string<const TypeParam[2]>::value));
  EXPECT_TRUE((fmt::internal::is_string<std::basic_string<TypeParam>>::value));
  EXPECT_TRUE(
        (fmt::internal::is_string<fmt::basic_string_view<TypeParam>>::value));
  EXPECT_TRUE(
        (fmt::internal::is_string<derived_from_string_view<TypeParam>>::value));
#ifdef FMT_STRING_VIEW
  EXPECT_TRUE((fmt::internal::is_string<FMT_STRING_VIEW<TypeParam>>::value));
#endif
  EXPECT_TRUE((fmt::internal::is_string<my_ns::my_string<TypeParam>>::value));
  EXPECT_FALSE((fmt::internal::is_string<my_ns::non_string>::value));
  EXPECT_TRUE((fmt::internal::is_string<FakeQt::QString>::value));
}